

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<EnumDef>::emplace<EnumDef_const&>
          (QMovableArrayOps<EnumDef> *this,qsizetype i,EnumDef *args)

{
  EnumDef **ppEVar1;
  qsizetype *pqVar2;
  EnumDef *pEVar3;
  Data *pDVar4;
  long lVar5;
  Data *pDVar6;
  char *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  char *pcVar10;
  qsizetype qVar11;
  Data *pDVar12;
  char *pcVar13;
  qsizetype qVar14;
  EnumDef *pEVar15;
  Data *pDVar16;
  long in_FS_OFFSET;
  bool bVar17;
  EnumDef tmp;
  QArrayDataPointer<QByteArray> QStack_50;
  Int local_38;
  undefined4 uStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00110896:
    pDVar6 = (args->name).d.d;
    pcVar7 = (args->name).d.ptr;
    qVar8 = (args->name).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    pDVar9 = (args->enumName).d.d;
    pcVar10 = (args->enumName).d.ptr;
    qVar11 = (args->enumName).d.size;
    if (pDVar9 != (Data *)0x0) {
      LOCK();
      (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pDVar12 = (args->type).d.d;
    pcVar13 = (args->type).d.ptr;
    qVar14 = (args->type).d.size;
    if (pDVar12 != (Data *)0x0) {
      LOCK();
      (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QStack_50.d = (args->values).d.d;
    QStack_50.ptr = (args->values).d.ptr;
    QStack_50.size = (args->values).d.size;
    if (QStack_50.d != (Data *)0x0) {
      LOCK();
      ((QStack_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _local_38 = CONCAT44(0xaaaaaaaa,
                         (args->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
                         super_QFlagsStorage<QtMocConstants::EnumFlags>.i);
    bVar17 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size != 0;
    QArrayDataPointer<EnumDef>::detachAndGrow
              ((QArrayDataPointer<EnumDef> *)this,(uint)(i == 0 && bVar17),1,(EnumDef **)0x0,
               (QArrayDataPointer<EnumDef> *)0x0);
    pEVar15 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr;
    if (i == 0 && bVar17) {
      pEVar15[-1].name.d.d = pDVar6;
      pEVar15[-1].name.d.ptr = pcVar7;
      pEVar15[-1].name.d.size = qVar8;
      pEVar15[-1].enumName.d.d = pDVar9;
      pEVar15[-1].enumName.d.ptr = pcVar10;
      pEVar15[-1].enumName.d.size = qVar11;
      pEVar15[-1].type.d.d = pDVar12;
      pEVar15[-1].type.d.ptr = pcVar13;
      pEVar15[-1].type.d.size = qVar14;
      pEVar15[-1].values.d.d = QStack_50.d;
      pEVar15[-1].values.d.ptr = QStack_50.ptr;
      pEVar15[-1].values.d.size = QStack_50.size;
      pEVar15[-1].flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i = local_38;
      ppEVar1 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr;
      *ppEVar1 = *ppEVar1 + -1;
    }
    else {
      pEVar3 = pEVar15 + i;
      memmove(pEVar3 + 1,pEVar15 + i,
              ((this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size - i) *
              0x68);
      (pEVar3->name).d.d = pDVar6;
      (pEVar3->name).d.ptr = pcVar7;
      (pEVar3->name).d.size = qVar8;
      (pEVar3->enumName).d.d = pDVar9;
      (pEVar3->enumName).d.ptr = pcVar10;
      (pEVar3->enumName).d.size = qVar11;
      (pEVar3->type).d.d = pDVar12;
      (pEVar3->type).d.ptr = pcVar13;
      (pEVar3->type).d.size = qVar14;
      (pEVar3->values).d.d = QStack_50.d;
      (pEVar3->values).d.ptr = QStack_50.ptr;
      (pEVar3->values).d.size = QStack_50.size;
      (pEVar3->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i = local_38;
    }
    QStack_50.size = 0;
    QStack_50.ptr = (QByteArray *)0x0;
    QStack_50.d = (Data *)0x0;
    pqVar2 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size;
    *pqVar2 = *pqVar2 + 1;
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&QStack_50);
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x4ec4ec4ec4ec4ec5)) {
      pEVar15 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr;
      pDVar6 = (args->name).d.d;
      pEVar15[lVar5].name.d.d = pDVar6;
      pEVar15[lVar5].name.d.ptr = (args->name).d.ptr;
      pEVar15[lVar5].name.d.size = (args->name).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar6 = (args->enumName).d.d;
      pEVar15[lVar5].enumName.d.d = pDVar6;
      pEVar15[lVar5].enumName.d.ptr = (args->enumName).d.ptr;
      pEVar15[lVar5].enumName.d.size = (args->enumName).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar6 = (args->type).d.d;
      pEVar15[lVar5].type.d.d = pDVar6;
      pEVar15[lVar5].type.d.ptr = (args->type).d.ptr;
      pEVar15[lVar5].type.d.size = (args->type).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar16 = (args->values).d.d;
      pEVar15[lVar5].values.d.d = pDVar16;
      pEVar15[lVar5].values.d.ptr = (args->values).d.ptr;
      pEVar15[lVar5].values.d.size = (args->values).d.size;
      if (pDVar16 != (Data *)0x0) {
        LOCK();
        (pDVar16->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar16->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pEVar15[lVar5].flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (args->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((EnumDef *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr))
      goto LAB_00110896;
      pEVar15 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr;
      pDVar6 = (args->name).d.d;
      pEVar15[-1].name.d.d = pDVar6;
      pEVar15[-1].name.d.ptr = (args->name).d.ptr;
      pEVar15[-1].name.d.size = (args->name).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar6 = (args->enumName).d.d;
      pEVar15[-1].enumName.d.d = pDVar6;
      pEVar15[-1].enumName.d.ptr = (args->enumName).d.ptr;
      pEVar15[-1].enumName.d.size = (args->enumName).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar6 = (args->type).d.d;
      pEVar15[-1].type.d.d = pDVar6;
      pEVar15[-1].type.d.ptr = (args->type).d.ptr;
      pEVar15[-1].type.d.size = (args->type).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar16 = (args->values).d.d;
      pEVar15[-1].values.d.d = pDVar16;
      pEVar15[-1].values.d.ptr = (args->values).d.ptr;
      pEVar15[-1].values.d.size = (args->values).d.size;
      if (pDVar16 != (Data *)0x0) {
        LOCK();
        (pDVar16->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar16->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pEVar15[-1].flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (args->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
      ppEVar1 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr;
      *ppEVar1 = *ppEVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }